

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::finishStreamWithError
          (QHttp2ProtocolHandler *this,QHttp2Stream *stream,NetworkError error,QString *message)

{
  bool bVar1;
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_RCX;
  QHttp2Stream *in_RSI;
  QHttp2Stream *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkReply *httpReply;
  HttpMessagePair *pair;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  QMessageLogger *this_00;
  char *in_stack_ffffffffffffffb8;
  QDebug local_40;
  Http2Error in_stack_ffffffffffffffcc;
  QString *local_28;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QHttp2Stream::sendRST_STREAM(in_RDI,in_stack_ffffffffffffffcc);
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::value
            (in_RCX,(QHttp2Stream **)0xaaaaaaaaaaaaaaaa);
  this_00 = (QMessageLogger *)&stack0xffffffffffffffc8;
  if (local_28 != (QString *)0x0) {
    QObject::disconnect(&in_RDI->super_QObject,(QObject *)in_stack_ffffffffffffff68,(char *)0x2d23d2
                       );
    QHttpNetworkReply::finishedWithError
              ((QHttpNetworkReply *)in_RDI,(NetworkError)((ulong)local_28 >> 0x20),
               (QString *)in_stack_ffffffffffffff68);
  }
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::QT_HTTP2();
  anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_RDI,in_stack_ffffffffffffff68);
  while( true ) {
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_657c77::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x2d243b);
    QMessageLogger::QMessageLogger
              (this_00,(char *)local_28,(int)((ulong)in_RDI >> 0x20),
               (char *)in_stack_ffffffffffffff68,(char *)0x2d2451);
    QMessageLogger::warning();
    in_stack_ffffffffffffff68 =
         (QLoggingCategory *)QDebug::operator<<((QDebug *)in_RCX,in_stack_ffffffffffffffb8);
    QHttp2Stream::streamID(in_RSI);
    QDebug::operator<<((QDebug *)in_RDI,(uint)((ulong)in_stack_ffffffffffffff68 >> 0x20));
    QDebug::operator<<((QDebug *)in_RCX,in_stack_ffffffffffffffb8);
    QDebug::operator<<((QDebug *)this_00,local_28);
    QDebug::~QDebug(&local_40);
    local_10 = 0;
  }
  std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
            ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2d24c7);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2ProtocolHandler::finishStreamWithError(QHttp2Stream *stream,
        QNetworkReply::NetworkError error, const QString &message)
{
    stream->sendRST_STREAM(CANCEL);
    const HttpMessagePair &pair = requestReplyPairs.value(stream);
    if (auto *httpReply = pair.second) {
        httpReply->disconnect(this);

        // TODO: error message must be translated!!! (tr)
        emit httpReply->finishedWithError(error, message);
    }

    qCWarning(QT_HTTP2) << "stream" << stream->streamID() << "finished with error:" << message;
}